

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzer.cpp
# Opt level: O2

bool __thiscall
HdmiCecAnalyzer::ReadStartSequence(HdmiCecAnalyzer *this,Frame *frame,bool at_start_of_sequence)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  undefined7 in_register_00000011;
  float fVar5;
  
  if ((int)CONCAT71(in_register_00000011,at_start_of_sequence) == 0) {
    iVar2 = AnalyzerChannelData::GetBitState();
    if (iVar2 == 0) {
      AnalyzerChannelData::AdvanceToNextEdge();
    }
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  frame[0x20] = (Frame)0x0;
  *(undefined8 *)(frame + 0x10) = 0;
  uVar3 = AnalyzerChannelData::GetSampleNumber();
  *(undefined8 *)frame = uVar3;
  Analyzer::GetSampleRate();
  Analyzer::GetSampleRate();
  Analyzer::GetSampleRate();
  Analyzer::GetSampleRate();
  iVar2 = AnalyzerChannelData::Advance((uint)this->mCec);
  if ((((iVar2 == 0) && (iVar2 = AnalyzerChannelData::Advance((uint)this->mCec), iVar2 != 0)) &&
      (iVar2 = AnalyzerChannelData::GetBitState(), iVar2 != 0)) &&
     (iVar2 = AnalyzerChannelData::Advance((uint)this->mCec), iVar2 == 0)) {
    AnalyzerChannelData::AdvanceToNextEdge();
    fVar5 = TimeSince(this,*(S64 *)frame);
    if (fVar5 < 4.3) {
      return false;
    }
    if (4.7 < fVar5) {
      return false;
    }
    while( true ) {
      AnalyzerChannelData::GetSampleNumber();
      cVar1 = AnalyzerChannelData::WouldAdvancingCauseTransition((uint)this->mCec);
      if (cVar1 == '\0') break;
      AnalyzerChannelData::AdvanceToNextEdge();
    }
    iVar2 = AnalyzerChannelData::GetBitState();
    if (iVar2 != 1) {
      AnalyzerResults::AddMarker
                ((ulonglong)(this->mResults)._M_ptr,(MarkerType)*(undefined8 *)frame,(Channel *)0x8)
      ;
      lVar4 = AnalyzerChannelData::GetSampleNumber();
      *(long *)(frame + 8) = lVar4 + -1;
      return true;
    }
  }
  return false;
}

Assistant:

bool HdmiCecAnalyzer::ReadStartSequence( Frame& frame, bool at_start_of_sequence )
{
    // All timing values are taken from the CEC spec, section 5.2.1 "Start Bit Timing"

    if( !at_start_of_sequence )
    {
        // The bus should be in HIGH
        if( mCec->GetBitState() == BIT_LOW )
            mCec->AdvanceToNextEdge();

        // Advance to the next falling edge
        mCec->AdvanceToNextEdge(); // HIGH to LOW
    }

    frame.mType = HdmiCec::FrameType_StartSeq;
    frame.mData1 = 0;
    frame.mStartingSampleInclusive = mCec->GetSampleNumber();

    U32 samples_to_start_of_rising_edge_zone = double( GetSampleRate() ) * ( HdmiCec::Tim_Start_AMin / 1000.0 ); // convert ms to s
    U32 samples_to_end_of_rising_edge_zone = double( GetSampleRate() ) * ( HdmiCec::Tim_Start_AMax / 1000.0 );   // convert ms to s
    U32 samples_to_start_of_falling_edge_zone = double( GetSampleRate() ) * ( HdmiCec::Tim_Start_BMin / 1000.0 );
    U32 samples_to_end_of_falling_edge_zone = double( GetSampleRate() ) * ( HdmiCec::Tim_Start_BMax / 1000.0 );

    U32 transitions = 0;
    transitions = mCec->Advance( samples_to_start_of_rising_edge_zone );
    if( transitions > 0 ) // have to stay low during this time
        return false;

    transitions = mCec->Advance( samples_to_end_of_rising_edge_zone - samples_to_start_of_rising_edge_zone );
    if( ( transitions == 0 ) || ( mCec->GetBitState() == BIT_LOW ) ) // has to transition to HIGH in this time and end up HIGH
        return false;

    transitions = mCec->Advance( samples_to_start_of_falling_edge_zone - samples_to_end_of_rising_edge_zone );
    if( transitions > 0 ) // have to stay high during this time
        return false;


    // Need to snap to the last falling edge in the range of the falling edge

    mCec->AdvanceToNextEdge();
    float elapsed = TimeSince( frame.mStartingSampleInclusive );
    if( elapsed < HdmiCec::Tim_Start_BMin || elapsed > HdmiCec::Tim_Start_BMax )
        return false;

    // We now have a valid falling edge
    U32 current_samples_to_end = samples_to_end_of_falling_edge_zone - ( mCec->GetSampleNumber() - frame.mStartingSampleInclusive );
    while( mCec->WouldAdvancingCauseTransition( current_samples_to_end ) )
    {
        mCec->AdvanceToNextEdge();
        current_samples_to_end = samples_to_end_of_falling_edge_zone - ( mCec->GetSampleNumber() - frame.mStartingSampleInclusive );
    }

    if( mCec->GetBitState() == BIT_HIGH )
        return false;

    //// Advance until the end of the "a" pulse
    // mCec->AdvanceToNextEdge(); // LOW to HIGH
    // float elapsed = TimeSince( frame.mStartingSampleInclusive );

    //// Check that pulse ends in the correct time
    // if( elapsed < HdmiCec::Tim_Start_AMin || elapsed > HdmiCec::Tim_Start_AMax )
    //    return false;

    //// Advance until the end of the "b" pulse
    // mCec->AdvanceToNextEdge(); // HIGH to LOW
    // elapsed = TimeSince( frame.mStartingSampleInclusive );

    //// Check that the pulse ends in the correct time
    // if( elapsed < HdmiCec::Tim_Start_BMin || elapsed > HdmiCec::Tim_Start_BMax )
    //    return false;

    // Add start marker on beginning sequence
    mResults->AddMarker( frame.mStartingSampleInclusive, AnalyzerResults::Start, mSettings->mCecChannel );

    // The last sample is the sample just before the edge
    frame.mEndingSampleInclusive = mCec->GetSampleNumber() - 1;
    return true;
}